

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.c
# Opt level: O3

Box * CreateBox(char *file,Size heapSize)

{
  Box *__ptr;
  Library *pLVar1;
  
  __ptr = (Box *)malloc(0x18);
  if (__ptr != (Box *)0x0) {
    pLVar1 = CreateLibrary(file);
    __ptr->library = pLVar1;
    if (pLVar1 != (Library *)0x0) {
      __ptr->heap = (Heap *)0x0;
      __ptr->heapSize = heapSize;
      return __ptr;
    }
    free(__ptr);
  }
  return (Box *)0x0;
}

Assistant:

Box *CreateBox(const char *file, Size heapSize)
{
    Box *box = malloc(sizeof(Box));
    if (!box)
    {
        return NULL;
    }
    box->library = CreateLibrary(file);
    if (!box->library)
    {
        free(box);
        return NULL;
    }
    box->heap = NULL;
    box->heapSize = heapSize;
    return box;
}